

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write-cmake.cpp
# Opt level: O1

bool CMakeWriter::write_copy_resources_for_distribution_using_rsync<chibi::StringBuilder>
               (StringBuilder *sb,ChibiLibrary *app,ChibiLibrary *library,char *destination_path)

{
  pointer pbVar1;
  char *depends;
  const_iterator __begin3;
  pointer pbVar2;
  StringBuilder exclude_args;
  StringBuilder local_50;
  
  write_custom_command_for_distribution_va<chibi::StringBuilder>
            (sb,(app->name)._M_dataplus._M_p,(library->resource_path)._M_dataplus._M_p,
             "${CMAKE_COMMAND} -E make_directory \"%s\"");
  chibi::StringBuilder::StringBuilder(&local_50);
  pbVar1 = (library->resource_excludes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (library->resource_excludes).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    std::__cxx11::string::append((char *)sb);
    std::__cxx11::string::append((char *)sb);
    std::__cxx11::string::append((char *)sb);
  }
  depends = (library->resource_path)._M_dataplus._M_p;
  write_custom_command_for_distribution_va<chibi::StringBuilder>
            (sb,(app->name)._M_dataplus._M_p,depends,"rsync -a %s \"%s/\" \"%s\"",
             local_50.text._M_dataplus._M_p,depends,destination_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.text._M_dataplus._M_p != &local_50.text.field_2) {
    operator_delete(local_50.text._M_dataplus._M_p);
  }
  return true;
}

Assistant:

static bool write_copy_resources_for_distribution_using_rsync(S & sb, const ChibiLibrary & app, const ChibiLibrary & library, const char * destination_path)
	{
		// use rsync to copy resources

		// but first make sure the target directory exists

		// note : we use a conditional to check if we're building a distribution app bundle
		//        ideally CMake would have build config dependent custom commands,
		//        but since it doesn't, we prepend 'echo' to the command, depending on
		//        whether this is a distribution build or not

		write_custom_command_for_distribution_va(sb,
			app.name.c_str(),
			library.resource_path.c_str(),
			"${CMAKE_COMMAND} -E make_directory \"%s\"",
			destination_path);
		
		StringBuilder exclude_args;

		if (library.resource_excludes.empty() == false)
		{
			for (auto & exclude : library.resource_excludes)
			{
				sb.Append("--exclude '");
				sb.Append(exclude.c_str());
				sb.Append("' ");
			}
		}

		// rsync
		write_custom_command_for_distribution_va(sb,
			app.name.c_str(),
			library.resource_path.c_str(),
			"rsync -a %s \"%s/\" \"%s\"",
			exclude_args.text.c_str(),
			library.resource_path.c_str(),
			destination_path);
		
		return true;
	}